

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

TVariable * __thiscall
glslang::HlslParseContext::makeInternalVariable(HlslParseContext *this,char *name,TType *type)

{
  TSymbolTable *pTVar1;
  TString *name_00;
  TVariable *this_00;
  
  name_00 = NewPoolTString_abi_cxx11_(name);
  this_00 = (TVariable *)TSymbol::operator_new((TSymbol *)0xf8,(size_t)name);
  TVariable::TVariable(this_00,name_00,type,false);
  pTVar1 = (this->super_TParseContextBase).symbolTable;
  pTVar1->uniqueId = pTVar1->uniqueId + 1;
  (*(this_00->super_TSymbol)._vptr_TSymbol[0xe])(this_00);
  return this_00;
}

Assistant:

TVariable* HlslParseContext::makeInternalVariable(const char* name, const TType& type) const
{
    TString* nameString = NewPoolTString(name);
    TVariable* variable = new TVariable(nameString, type);
    symbolTable.makeInternalVariable(*variable);

    return variable;
}